

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O2

bool __thiscall CumulativeCalProp::propagate(CumulativeCalProp *this)

{
  undefined1 *this_00;
  uint i;
  int iVar1;
  int *piVar2;
  int *piVar3;
  IntVar *pIVar4;
  IntVar *pIVar5;
  int *piVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  IntVar **ppIVar12;
  int ii_1;
  ulong uVar13;
  int ii;
  uint uVar14;
  
  this_00 = &(this->super_Propagator).field_0x14;
  uVar14 = *(uint *)&(this->super_Propagator).field_0x14;
  uVar13 = (ulong)uVar14;
  do {
    if ((int)uVar14 < 0) {
      iVar10 = this->minTime;
      iVar1 = this->maxTime;
      Tint::operator=((Tint *)this_00,(int)uVar13);
      do {
        this->bound_update = false;
        this->tt_profile_size = 0;
        if ((this->tt_check == false) && (this->tt_filt != true)) {
          bVar8 = 0;
        }
        else {
          bVar7 = time_table_propagation(this,&this->task_id,iVar10,iVar1);
          if (!bVar7) {
            return false;
          }
          bVar8 = this->bound_update;
        }
        iVar11 = *(int *)this_00;
        if ((0 < iVar11 && (bVar8 & 1) == 0) &&
           ((this->ttef_check != false || (this->ttef_filt == true)))) {
          lVar9 = this->nb_prop_calls + 1;
          this->nb_prop_calls = lVar9;
          if ((this->ttef_prop_factor == 0) || (lVar9 % this->ttef_prop_factor == 0)) {
            for (lVar9 = 0; lVar9 <= iVar11; lVar9 = lVar9 + 1) {
              retrieveEnergyParameters(this,(this->task_id).data[lVar9]);
              iVar11 = *(int *)&(this->super_Propagator).field_0x14;
            }
            ttef_initialise_parameters(this);
            if (this->ttef_filt == false) {
              bVar7 = ttef_consistency_check(this,1);
            }
            else {
              bVar7 = ttef_bounds_propagation(this,1,2);
            }
            if (bVar7 == false) {
              return false;
            }
          }
        }
        if (this->idem != true) {
          return true;
        }
      } while (this->bound_update != false);
      return true;
    }
    ppIVar12 = (this->dur).data;
    i = (this->task_id).data[uVar14];
    if ((0 < (ppIVar12[i]->min).v) && (0 < ((this->usage).data[i]->min).v)) {
      retrieveCoreParameters(this,i);
      ppIVar12 = (this->dur).data;
    }
    piVar2 = this->est_2;
    piVar3 = this->lct_2;
    pIVar4 = (this->start).data[i];
    pIVar5 = ppIVar12[i];
    if ((pIVar4->min).v == (pIVar4->max).v) {
      iVar1 = (pIVar5->min).v;
      iVar10 = (pIVar5->max).v;
      if ((iVar1 != iVar10) ||
         (pIVar4 = (this->usage).data[i], iVar10 = iVar1, (pIVar4->min).v != (pIVar4->max).v))
      goto LAB_001538c6;
LAB_001538d8:
      piVar6 = (this->task_id).data;
      piVar6[uVar14] = piVar6[uVar13];
      piVar6[uVar13] = i;
      uVar13 = (ulong)((int)uVar13 - 1);
      piVar6 = this->min_energy2;
      if (((piVar6 != (int *)0x0) && (0 < (pIVar5->min).v)) &&
         (pIVar4 = (this->usage).data[i], 0 < (pIVar4->min).v)) {
        this->free_energy2[(int)i] = 0;
        if (this->rho == 1) {
          iVar10 = piVar3[(int)i] - piVar2[(int)i];
        }
        else {
          iVar10 = (pIVar5->min).v;
        }
        piVar6[(int)i] = iVar10 * (pIVar4->min).v;
      }
    }
    else {
      iVar10 = (pIVar5->max).v;
LAB_001538c6:
      if ((iVar10 < 1) || (((this->usage).data[i]->max).v < 1)) goto LAB_001538d8;
    }
    uVar14 = uVar14 - 1;
  } while( true );
}

Assistant:

CUMU_BOOL
	propagate() override {
#if CUMUVERB > 1
		fprintf(stderr, "Entering cumulative propagation\n");
#endif
		assert(last_unfixed >= 0);
		// Retrieval of the task's core data and updating
		// the fixed-task array
		int new_unfixed = last_unfixed;
		int tw_begin = maxTime;
		int tw_end = minTime;
		for (int ii = new_unfixed; ii >= 0; ii--) {
			const int i = task_id[ii];
			// Retrieve core data (est, lst, ect, lct)
			if (min_dur(i) > 0 && min_usage(i) > 0) {
				retrieveCoreParameters(i);
			}
			// Compute the time window for consideration
			tw_begin = std::min(tw_begin, est_2[i]);
			tw_end = std::max(tw_end, lct_2[i]);
			// Check whether the task 'i' is fixed
			if ((CUMU_PT_ISFIXED(start[i]) && CUMU_PT_ISFIXED(dur[i]) && CUMU_PT_ISFIXED(usage[i])) ||
					max_dur(i) <= 0 || max_usage(i) <= 0) {
				// Swapping the id's
				task_id[ii] = task_id[new_unfixed];
				task_id[new_unfixed] = i;
				new_unfixed--;
				if (min_energy2 != nullptr && min_dur(i) > 0 && min_usage(i) > 0) {
					free_energy2[i] = 0;
					if (rho == 1) {
						// Resource stays engaged
						min_energy2[i] = min_usage(i) * (lct_2[i] - est_2[i]);
					} else {
						// Resource is released
						min_energy2[i] = min_usage(i) * min_dur(i);
					}
				}
			}
		}
		tw_begin = minTime;
		tw_end = maxTime;
		// Trailing the index of the last unfixed task
		last_unfixed = new_unfixed;
#if CUMUVERB > 1
		fprintf(stderr, "\tEntering cumulative propagation loop\n");
#endif
		// idempotent
		do {
			bound_update = false;
			// Resetting the profile size
			tt_profile_size = 0;
			// Time-table propagators
			if (tt_check || tt_filt) {
				// Time-table propagation
				if (!time_table_propagation(task_id, tw_begin, tw_end)) {
					// Inconsistency was detected
#if CUMUVERB > 1
					fprintf(stderr, "Leaving cumulative propagation with failure\n");
#endif
					return false;
				}
			}
			// if (!bound_update)
			//	nb_prop_calls++;
			//  Time-table-edge-finding propagation
			if (!bound_update && last_unfixed > 0 &&
					(ttef_check || ttef_filt)) {  // && nb_prop_calls % 100 == 0) {
				nb_prop_calls++;
				if (ttef_prop_factor != 0 && nb_prop_calls % ttef_prop_factor != 0) {
					continue;
				}
#if CUMUVERB > 0
				fprintf(stderr, "Entering TTEF\n");
#endif
				// Retrieval of the data required for the TTEF propagation
				for (int ii = 0; ii <= last_unfixed; ii++) {
					const int i = task_id[ii];
					retrieveEnergyParameters(i);
				}
				// Initialisation of necessary structures
				// - Unfixed tasks sorted according earliest start time
				// - Unfixed tasks sorted according latest completion time
				// - Energy of the compulsory parts after the latest completion
				// 	 time of unfixed tasks
				// - Energy of the compulsory parts after the earliest start
				//   time of unfixed tasks
				ttef_initialise_parameters();

				// TTEF filtering algorithm
				if (ttef_filt) {
					if (!ttef_bounds_propagation(1, 2)) {
						// Inconsistency was detected
						return false;
					}
				} else {
#if CUMUVERB > 0
					fprintf(stderr, "Entering TTEF Consistency\n");
#endif
					if (!ttef_consistency_check(1)) {
						// Inconsistency was detected
						return false;
					}
#if CUMUVERB > 0
					fprintf(stderr, "Leaving TTEF Consistency\n");
#endif
				}
#if CUMUVERB > 0
				fprintf(stderr, "Leaving TTEF\n");
#endif
			}
		} while (idem && bound_update);
#if CUMUVERB > 0
		fprintf(stderr, "\tLeaving cumulative propagation loop\n");
		fprintf(stderr, "Leaving cumulative propagation without failure\n");
#endif
		return true;
	}